

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall
cmCursesMainForm::Render(cmCursesMainForm *this,int left,int top,int width,int height)

{
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var1;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var2;
  cmCursesLabelWidget *pcVar3;
  cmCursesWidget *pcVar4;
  bool bVar5;
  cmCursesStringWidget *sw;
  FIELD *field;
  void *pvVar6;
  char *pcVar7;
  cmValue cVar8;
  FORM *pFVar9;
  int iVar10;
  uint uVar11;
  undefined4 in_register_00000034;
  cmCursesCacheEntryComposite *entry_1;
  pointer pcVar12;
  cmCursesCacheEntryComposite *entry;
  allocator<char> local_9d;
  int local_9c;
  string local_98;
  int local_74;
  string local_70;
  pointer local_50;
  uint local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,left);
  pFVar9 = (this->super_cmCursesForm).Form;
  local_3c = top;
  if (pFVar9 != (FORM *)0x0) {
    field = current_field(pFVar9);
    pvVar6 = field_userptr(field);
    if (*(int *)((long)pvVar6 + 8) - 1U < 3) {
      *(undefined1 *)((long)pvVar6 + 0x3c) = 0;
    }
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (((0x40 < width) && (5 < height)) && (this->InitialWidth <= width)) {
    local_9c = height;
    if (this->AdvancedMode == true) {
      this->NumberOfVisibleEntries =
           (long)(this->Entries).
                 super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->Entries).
                 super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6;
    }
    else {
      this->NumberOfVisibleEntries = 0;
      pcVar12 = (this->Entries).
                super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (this->Entries).
                 super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar12 != local_50) {
        do {
          _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (((this->CMakeInstance)._M_t.
                 super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          pcVar7 = cmCursesCacheEntryComposite::GetValue(pcVar12);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,pcVar7,(allocator<char> *)&local_70);
          cVar8 = cmState::GetCacheEntryValue
                            ((cmState *)
                             _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                             _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (((this->CMakeInstance)._M_t.
                 super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          pcVar7 = cmCursesCacheEntryComposite::GetValue(pcVar12);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar7,&local_9d);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ADVANCED","");
          bVar5 = cmState::GetCacheEntryPropertyAsBool
                            ((cmState *)
                             _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                             _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98,
                             &local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((cVar8.Value != (string *)0x0) && ((!bVar5 || (this->AdvancedMode != false)))) {
            this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != local_50);
      }
    }
    this->NumberOfPages = 1;
    if (7 < local_9c) {
      pcVar12 = (this->Entries).
                super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (this->Entries).
                 super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar12 != local_50) {
        local_9c = local_9c + -7;
        local_40 = (int)local_38 + 0x20;
        local_44 = (int)local_38 + 0x21;
        local_74 = 0;
        do {
          _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (((this->CMakeInstance)._M_t.
                 super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          pcVar7 = cmCursesCacheEntryComposite::GetValue(pcVar12);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,pcVar7,(allocator<char> *)&local_70);
          cVar8 = cmState::GetCacheEntryValue
                            ((cmState *)
                             _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                             _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (((this->CMakeInstance)._M_t.
                 super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          pcVar7 = cmCursesCacheEntryComposite::GetValue(pcVar12);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar7,&local_9d);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ADVANCED","");
          bVar5 = cmState::GetCacheEntryPropertyAsBool
                            ((cmState *)
                             _Var1.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                             _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98,
                             &local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((cVar8.Value != (string *)0x0) && ((!bVar5 || (this->AdvancedMode != false)))) {
            iVar10 = local_74 % local_9c;
            bVar5 = 0 < local_74 / local_9c;
            if (iVar10 == 0 && bVar5) {
              this->NumberOfPages = this->NumberOfPages + 1;
            }
            _Var2._M_head_impl =
                 (pcVar12->Label)._M_t.
                 super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                 .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
            uVar11 = iVar10 + local_3c;
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_cmCursesWidget + 0x18))
                      (_Var2._M_head_impl,local_38,uVar11,iVar10 == 0 && bVar5);
            pcVar3 = (pcVar12->IsNewLabel)._M_t.
                     super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                     .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
            (**(code **)((long)(pcVar3->super_cmCursesWidget)._vptr_cmCursesWidget + 0x18))
                      (pcVar3,local_40,uVar11,0);
            pcVar4 = (pcVar12->Entry)._M_t.
                     super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
                     super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
            (*pcVar4->_vptr_cmCursesWidget[3])(pcVar4,(ulong)local_44,(ulong)uVar11,0);
            ((pcVar12->Entry)._M_t.
             super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
             super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
             super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->Page =
                 this->NumberOfPages;
            local_74 = local_74 + 1;
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != local_50);
      }
    }
    pFVar9 = new_form((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    (this->super_cmCursesForm).Form = pFVar9;
    post_form(pFVar9);
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    if (_stdscr == 0) {
      iVar10 = -1;
    }
    else {
      iVar10 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar10,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::Render(int left, int top, int width, int height)
{

  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cmCursesWidget* cw =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    // If in edit mode, get out of it
    if (cw->GetType() == cmStateEnums::STRING ||
        cw->GetType() == cmStateEnums::PATH ||
        cw->GetType() == cmStateEnums::FILEPATH) {
      cmCursesStringWidget* sw = static_cast<cmCursesStringWidget*>(cw);
      sw->SetInEdit(false);
    }
    // Delete the previous form
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }

  // Wrong window size
  if (width < cmCursesMainForm::MIN_WIDTH || width < this->InitialWidth ||
      height < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Leave room for toolbar
  height -= 7;

  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal, display only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }

  // Re-adjust the fields according to their place
  this->NumberOfPages = 1;
  if (height > 0) {
    bool isNewPage;
    int i = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      int row = (i % height) + 1;
      int page = (i / height) + 1;
      isNewPage = (page > 1) && (row == 1);

      if (isNewPage) {
        this->NumberOfPages++;
      }
      entry.Label->Move(left, top + row - 1, isNewPage);
      entry.IsNewLabel->Move(left + 32, top + row - 1, false);
      entry.Entry->Move(left + 33, top + row - 1, false);
      entry.Entry->SetPage(this->NumberOfPages);
      i++;
    }
  }

  // Post the form
  this->Form = new_form(this->Fields.data());
  post_form(this->Form);
  // Update toolbar
  this->UpdateStatusBar();
  this->PrintKeys();

  touchwin(stdscr);
  refresh();
}